

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragOpInteractionCase.cpp
# Opt level: O1

void __thiscall
deqp::gls::FragOpInteractionCase::ReferenceContext::ReferenceContext
          (ReferenceContext *this,RenderContext *renderCtx,int width,int height)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  PixelBufferAccess local_d0;
  MultisamplePixelBufferAccess local_a8;
  MultisamplePixelBufferAccess local_80;
  MultisamplePixelBufferAccess local_58;
  
  sglr::ReferenceContextLimits::ReferenceContextLimits(&this->limits,renderCtx);
  iVar1 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
  iVar2 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
  iVar2 = *(int *)(CONCAT44(extraout_var_00,iVar2) + 0x18);
  iVar3 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (&this->buffers,(PixelFormat *)(CONCAT44(extraout_var,iVar1) + 8),iVar2,
             *(int *)(CONCAT44(extraout_var_01,iVar3) + 0x1c),width,height,1);
  tcu::TextureLevel::getAccess(&local_d0,&(this->buffers).m_colorbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_d0);
  tcu::TextureLevel::getAccess(&local_d0,&(this->buffers).m_depthbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_d0);
  tcu::TextureLevel::getAccess(&local_d0,&(this->buffers).m_stencilbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_d0);
  sglr::ReferenceContext::ReferenceContext
            (&this->context,&this->limits,&local_58,&local_80,&local_a8);
  return;
}

Assistant:

ReferenceContext (glu::RenderContext& renderCtx, int width, int height)
		: limits	(renderCtx)
		, buffers	(renderCtx.getRenderTarget().getPixelFormat(), renderCtx.getRenderTarget().getDepthBits(), renderCtx.getRenderTarget().getStencilBits(), width, height)
		, context	(limits, buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer())
	{
	}